

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Boundary_Uniform.cpp
# Opt level: O2

void __thiscall
Nova::Boundary_Uniform<float,_1>::Fill_Ghost_Cells
          (Boundary_Uniform<float,_1> *this,T_Grid *grid,T_Arrays *u,T_Arrays *u_ghost,float dt,
          float time,int number_of_ghost_cells)

{
  float fVar1;
  float *pfVar2;
  Range<int,_1> *pRVar3;
  uint i;
  T_Index *index;
  Array<Nova::Range<int,_1>_> regions;
  T_Region local_6c;
  undefined1 local_68 [16];
  Range<int,_1> local_58;
  Vector<int,_1,_true> local_40;
  bool local_3c;
  
  local_6c = Whole_Region;
  Grid_Iterator_Cell<float,_1>::Grid_Iterator_Cell
            ((Grid_Iterator_Cell<float,_1> *)local_68,grid,0,&local_6c,0);
  while (local_3c != false) {
    pfVar2 = Array_ND<float,_1>::operator()(u,&local_40);
    fVar1 = *pfVar2;
    pfVar2 = Array_ND<float,_1>::operator()(u_ghost,&local_40);
    *pfVar2 = fVar1;
    Grid_Iterator<float,_1>::Next((Grid_Iterator<float,_1> *)local_68);
  }
  local_68._0_8_ = (Grid<float,_1> *)0x0;
  local_68._8_8_ = (pointer)0x0;
  local_58.min_corner._data._M_elems[0] = (T_STORAGE)0x0;
  local_58.max_corner._data._M_elems[0] = (T_STORAGE)0x0;
  Find_Ghost_Regions(this,grid,(Array<Nova::Range<int,_1>_> *)local_68,number_of_ghost_cells);
  for (i = 0; i != 2; i = i + 1) {
    pRVar3 = Array<Nova::Range<int,_1>_>::operator()((Array<Nova::Range<int,_1>_> *)local_68,i);
    (*(this->super_Boundary<float,_1>)._vptr_Boundary[8])(dt,time,this,grid,u_ghost,(ulong)i,pRVar3)
    ;
  }
  std::_Vector_base<Nova::Range<int,_1>,_std::allocator<Nova::Range<int,_1>_>_>::~_Vector_base
            ((_Vector_base<Nova::Range<int,_1>,_std::allocator<Nova::Range<int,_1>_>_> *)local_68);
  return;
}

Assistant:

void Boundary_Uniform<T,d>::
Fill_Ghost_Cells(const T_Grid& grid,const T_Arrays& u,T_Arrays& u_ghost,const T dt,const T time,const int number_of_ghost_cells)
{
    using Cell_Iterator         = Grid_Iterator_Cell<T,d>;

    for(Cell_Iterator iterator(grid);iterator.Valid();iterator.Next()){const T_Index& index=iterator.Cell_Index();
        u_ghost(index)=u(index);}
    Array<Range<int,d> > regions;
    Find_Ghost_Regions(grid,regions,number_of_ghost_cells);
    for(int side=0;side<T_Grid::number_of_faces_per_cell;++side) Fill_Single_Ghost_Region(grid,u_ghost,side,dt,time,regions(side));
}